

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDualRHS.cpp
# Opt level: O0

void __thiscall HEkkDualRHS::createArrayOfPrimalInfeasibilities(HEkkDualRHS *this)

{
  double dVar1;
  double dVar2;
  int iVar3;
  double *pdVar4;
  double *pdVar5;
  double *pdVar6;
  reference pvVar7;
  long *in_RDI;
  double primal_infeasibility;
  double upper;
  double lower;
  double value;
  HighsInt i;
  double Tp;
  double *baseUpper;
  double *baseLower;
  double *baseValue;
  HighsInt numRow;
  double local_58;
  int local_34;
  
  iVar3 = *(int *)(*in_RDI + 0x219c);
  pdVar4 = std::vector<double,_std::allocator<double>_>::data
                     ((vector<double,_std::allocator<double>_> *)0x79abb6);
  pdVar5 = std::vector<double,_std::allocator<double>_>::data
                     ((vector<double,_std::allocator<double>_> *)0x79abd9);
  pdVar6 = std::vector<double,_std::allocator<double>_>::data
                     ((vector<double,_std::allocator<double>_> *)0x79abfc);
  dVar1 = *(double *)(*(long *)(*in_RDI + 8) + 0x118);
  for (local_34 = 0; local_34 < iVar3; local_34 = local_34 + 1) {
    dVar2 = pdVar4[local_34];
    local_58 = 0.0;
    if (pdVar5[local_34] - dVar1 <= dVar2) {
      if (pdVar6[local_34] + dVar1 < dVar2) {
        local_58 = dVar2 - pdVar6[local_34];
      }
    }
    else {
      local_58 = pdVar5[local_34] - dVar2;
    }
    if ((*(byte *)(*in_RDI + 0x28c9) & 1) == 0) {
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 9),(long)local_34);
      *pvVar7 = ABS(local_58);
    }
    else {
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 9),(long)local_34);
      *pvVar7 = local_58 * local_58;
    }
  }
  return;
}

Assistant:

void HEkkDualRHS::createArrayOfPrimalInfeasibilities() {
  HighsInt numRow = ekk_instance_.lp_.num_row_;
  const double* baseValue = ekk_instance_.info_.baseValue_.data();
  const double* baseLower = ekk_instance_.info_.baseLower_.data();
  const double* baseUpper = ekk_instance_.info_.baseUpper_.data();
  const double Tp = ekk_instance_.options_->primal_feasibility_tolerance;
  for (HighsInt i = 0; i < numRow; i++) {
    // @primal_infeasibility calculation
    const double value = baseValue[i];
    const double lower = baseLower[i];
    const double upper = baseUpper[i];
    double primal_infeasibility = 0;
    if (value < lower - Tp) {
      primal_infeasibility = lower - value;
    } else if (value > upper + Tp) {
      primal_infeasibility = value - upper;
    }
    if (ekk_instance_.info_.store_squared_primal_infeasibility)
      work_infeasibility[i] = primal_infeasibility * primal_infeasibility;
    else
      work_infeasibility[i] = fabs(primal_infeasibility);
  }
}